

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

int __thiscall
ddd::DictionaryMLT<false,_true>::stat(DictionaryMLT<false,_true> *this,char *__file,stat *__buf)

{
  pointer pBVar1;
  pointer pcVar2;
  uint uVar3;
  DaTrie<false,_true,_true> *this_00;
  DaTrie<false,_true,_false> *this_01;
  pointer pBVar4;
  pointer pcVar5;
  size_t sVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  *(undefined8 *)__file = *(undefined8 *)(this + 0x30);
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  this_00 = *(DaTrie<false,_true,_true> **)(this + 8);
  uVar3 = this_00->bc_emps_;
  pBVar4 = (this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pBVar1 = (this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar9._8_4_ = (int)pBVar1;
  auVar9._0_8_ = pBVar1;
  auVar9._12_4_ = (int)((ulong)pBVar1 >> 0x20);
  uVar7 = (ulong)((long)(this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)pBVar1) >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar7 - uVar3);
  *(ulong *)(__file + 0x18) = uVar7 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)((long)pBVar4 - auVar9._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar3;
  pcVar5 = (this_00->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (this_00->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar10._8_4_ = (int)pcVar2;
  auVar10._0_8_ = pcVar2;
  auVar10._12_4_ = (int)((ulong)pcVar2 >> 0x20);
  *(ulong *)(__file + 0x30) =
       (long)(this_00->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pcVar2 & 0xffffffff;
  *(ulong *)(__file + 0x38) = (long)pcVar5 - auVar10._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)this_00->tail_emps_;
  sVar6 = DaTrie<false,_true,_true>::size_in_bytes(this_00);
  *(size_t *)(__file + 0x48) = sVar6;
  for (uVar7 = 0; uVar7 < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3);
      uVar7 = uVar7 + 1) {
    this_01 = *(DaTrie<false,_true,_false> **)(*(long *)(this + 0x10) + uVar7 * 8);
    if (this_01 != (DaTrie<false,_true,_false> *)0x0) {
      uVar3 = this_01->bc_emps_;
      pBVar4 = (this_01->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pBVar1 = (this_01->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar11._8_4_ = (int)pBVar1;
      auVar11._0_8_ = pBVar1;
      auVar11._12_4_ = (int)((ulong)pBVar1 >> 0x20);
      uVar8 = (ulong)((long)(this_01->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3;
      *(ulong *)(__file + 0x10) = *(long *)(__file + 0x10) + (ulong)((int)uVar8 - uVar3);
      *(ulong *)(__file + 0x18) = *(long *)(__file + 0x18) + (uVar8 & 0xffffffff);
      *(ulong *)(__file + 0x20) =
           *(long *)(__file + 0x20) + ((ulong)((long)pBVar4 - auVar11._8_8_) >> 3 & 0xffffffff);
      *(ulong *)(__file + 0x28) = *(long *)(__file + 0x28) + (ulong)uVar3;
      pcVar5 = (this_01->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pcVar2 = (this_01->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar12._8_4_ = (int)pcVar2;
      auVar12._0_8_ = pcVar2;
      auVar12._12_4_ = (int)((ulong)pcVar2 >> 0x20);
      *(ulong *)(__file + 0x30) =
           ((long)(this_01->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2 & 0xffffffffU) +
           *(long *)(__file + 0x30);
      *(ulong *)(__file + 0x38) =
           ((long)pcVar5 - auVar12._8_8_ & 0xffffffffU) + *(long *)(__file + 0x38);
      *(ulong *)(__file + 0x40) = *(long *)(__file + 0x40) + (ulong)this_01->tail_emps_;
      sVar6 = DaTrie<false,_true,_false>::size_in_bytes(this_01);
      sVar6 = sVar6 + *(long *)(__file + 0x48);
      *(long *)(__file + 8) = *(long *)(__file + 8) + 1;
    }
    sVar6 = sVar6 + 1;
    *(size_t *)(__file + 0x48) = sVar6;
  }
  *(size_t *)(__file + 0x48) = sVar6 + 0x14;
  return (int)(sVar6 + 0x14);
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }